

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzSubMod_fast(word *c,word *a,word *b,word *mod,size_t n)

{
  word wVar1;
  
  wVar1 = zzSub(c,a,b,n);
  if (wVar1 != 0) {
    zzAdd2(c,mod,n);
    return;
  }
  return;
}

Assistant:

void FAST(zzSubMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	// a < b => a - b + mod < mod
	if (zzSub(c, a, b, n))
		zzAdd2(c, mod, n);
}